

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgpaintelement.cpp
# Opt level: O1

bool __thiscall
lunasvg::SVGLinearGradientElement::applyPaint
          (SVGLinearGradientElement *this,SVGRenderState *state,float opacity)

{
  SpreadMethod spread;
  pointer paVar1;
  pointer paVar2;
  float x1;
  float y1;
  float x2;
  float y2;
  float e;
  float extraout_XMM0_Db;
  float f;
  float a;
  float d;
  GradientStops gradientStops;
  LengthContext lengthContext;
  Transform gradientTransform;
  SVGLinearGradientAttributes attributes;
  GradientStops local_c0;
  LengthContext local_a8;
  Transform local_98;
  SVGLinearGradientAttributes local_80;
  Transform local_40;
  
  collectGradientAttributes(&local_80,this);
  buildGradientStops(&local_c0,local_80.super_SVGGradientAttributes.m_gradientContentElement,opacity
                    );
  paVar2 = local_c0.
           super__Vector_base<plutovg_gradient_stop_t,_std::allocator<plutovg_gradient_stop_t>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  paVar1 = local_c0.
           super__Vector_base<plutovg_gradient_stop_t,_std::allocator<plutovg_gradient_stop_t>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (local_c0.super__Vector_base<plutovg_gradient_stop_t,_std::allocator<plutovg_gradient_stop_t>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_c0.super__Vector_base<plutovg_gradient_stop_t,_std::allocator<plutovg_gradient_stop_t>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_a8.m_units =
         ((local_80.super_SVGGradientAttributes.m_gradientUnits)->m_gradientUnits).super_SVGProperty
         .field_0x9;
    local_a8.m_element = (SVGElement *)this;
    x1 = LengthContext::valueForLength
                   (&local_a8,(Length *)&((local_80.m_x1)->m_x1).super_SVGProperty.field_0xc,
                    ((local_80.m_x1)->m_x1).super_SVGProperty.field_0x9);
    y1 = LengthContext::valueForLength
                   (&local_a8,(Length *)&((local_80.m_y1)->m_y1).super_SVGProperty.field_0xc,
                    ((local_80.m_y1)->m_y1).super_SVGProperty.field_0x9);
    x2 = LengthContext::valueForLength
                   (&local_a8,(Length *)&((local_80.m_x2)->m_x2).super_SVGProperty.field_0xc,
                    ((local_80.m_x2)->m_x2).super_SVGProperty.field_0x9);
    y2 = LengthContext::valueForLength
                   (&local_a8,(Length *)&((local_80.m_y2)->m_y2).super_SVGProperty.field_0xc,
                    ((local_80.m_y2)->m_y2).super_SVGProperty.field_0x9);
    if (((long)local_c0.
               super__Vector_base<plutovg_gradient_stop_t,_std::allocator<plutovg_gradient_stop_t>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)local_c0.
               super__Vector_base<plutovg_gradient_stop_t,_std::allocator<plutovg_gradient_stop_t>_>
               ._M_impl.super__Vector_impl_data._M_start == 0x14) ||
       ((((x1 == x2 && (!NAN(x1) && !NAN(x2))) && (y1 == y2)) && (!NAN(y1) && !NAN(y2))))) {
      Canvas::setColor((state->m_canvas).
                       super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                       local_c0.
                       super__Vector_base<plutovg_gradient_stop_t,_std::allocator<plutovg_gradient_stop_t>_>
                       ._M_impl.super__Vector_impl_data._M_finish[-1].color.r,
                       local_c0.
                       super__Vector_base<plutovg_gradient_stop_t,_std::allocator<plutovg_gradient_stop_t>_>
                       ._M_impl.super__Vector_impl_data._M_finish[-1].color.g,
                       local_c0.
                       super__Vector_base<plutovg_gradient_stop_t,_std::allocator<plutovg_gradient_stop_t>_>
                       ._M_impl.super__Vector_impl_data._M_finish[-1].color.b,
                       local_c0.
                       super__Vector_base<plutovg_gradient_stop_t,_std::allocator<plutovg_gradient_stop_t>_>
                       ._M_impl.super__Vector_impl_data._M_finish[-1].color.a);
    }
    else {
      spread = ((local_80.super_SVGGradientAttributes.m_spreadMethod)->m_spreadMethod).
               super_SVGProperty.field_0x9;
      local_98.m_matrix.a =
           *(float *)&((local_80.super_SVGGradientAttributes.m_gradientTransform)->
                      m_gradientTransform).super_SVGProperty.field_0xc;
      local_98.m_matrix.b =
           *(float *)&((local_80.super_SVGGradientAttributes.m_gradientTransform)->
                      m_gradientTransform).field_0x10;
      local_98.m_matrix.c =
           *(float *)&((local_80.super_SVGGradientAttributes.m_gradientTransform)->
                      m_gradientTransform).field_0x14;
      local_98.m_matrix.d =
           *(float *)&((local_80.super_SVGGradientAttributes.m_gradientTransform)->
                      m_gradientTransform).field_0x18;
      local_98.m_matrix.e =
           *(float *)&((local_80.super_SVGGradientAttributes.m_gradientTransform)->
                      m_gradientTransform).field_0x1c;
      local_98.m_matrix.f =
           *(float *)&((local_80.super_SVGGradientAttributes.m_gradientTransform)->
                      m_gradientTransform).field_0x20;
      if (((local_80.super_SVGGradientAttributes.m_gradientUnits)->m_gradientUnits).
          super_SVGProperty.field_0x9 == '\x01') {
        a = y2;
        d = extraout_XMM0_Db;
        (*(state->m_element->super_SVGNode)._vptr_SVGNode[0xb])();
        Transform::Transform(&local_40,a,0.0,0.0,d,e,f);
        Transform::postMultiply(&local_98,&local_40);
      }
      Canvas::setLinearGradient
                ((state->m_canvas).super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,x1,y1,x2,y2,spread,&local_c0,&local_98);
    }
  }
  if (local_c0.super__Vector_base<plutovg_gradient_stop_t,_std::allocator<plutovg_gradient_stop_t>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.
                    super__Vector_base<plutovg_gradient_stop_t,_std::allocator<plutovg_gradient_stop_t>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_c0.
                          super__Vector_base<plutovg_gradient_stop_t,_std::allocator<plutovg_gradient_stop_t>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.
                          super__Vector_base<plutovg_gradient_stop_t,_std::allocator<plutovg_gradient_stop_t>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return paVar1 != paVar2;
}

Assistant:

bool SVGLinearGradientElement::applyPaint(SVGRenderState& state, float opacity) const
{
    auto attributes = collectGradientAttributes();
    auto gradientContentElement = attributes.gradientContentElement();
    auto gradientStops = buildGradientStops(gradientContentElement, opacity);
    if(gradientStops.empty())
        return false;
    LengthContext lengthContext(this, attributes.gradientUnits());
    auto x1 = lengthContext.valueForLength(attributes.x1());
    auto y1 = lengthContext.valueForLength(attributes.y1());
    auto x2 = lengthContext.valueForLength(attributes.x2());
    auto y2 = lengthContext.valueForLength(attributes.y2());
    if(gradientStops.size() == 1 || (x1 == x2 && y1 == y2)) {
        const auto& lastStop = gradientStops.back();
        state->setColor(lastStop.color.r, lastStop.color.g, lastStop.color.b, lastStop.color.a);
        return true;
    }

    auto spreadMethod = attributes.spreadMethod();
    auto gradientUnits = attributes.gradientUnits();
    auto gradientTransform = attributes.gradientTransform();
    if(gradientUnits == Units::ObjectBoundingBox) {
        auto bbox = state.fillBoundingBox();
        gradientTransform.postMultiply(Transform(bbox.w, 0, 0, bbox.h, bbox.x, bbox.y));
    }

    state->setLinearGradient(x1, y1, x2, y2, spreadMethod, gradientStops, gradientTransform);
    return true;
}